

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O0

MPP_RET h264e_start(void *ctx,HalEncTask *task)

{
  RK_S32 RVar1;
  MppEncH264Cfg *h264;
  H264eCtx *p;
  RK_U32 local_40;
  RK_S32 force_tid;
  RK_S32 base_layer_pid;
  RK_S32 force_frame_qp;
  RK_S32 force_use_lt_idx;
  RK_S32 force_lt_idx;
  MppMeta meta;
  EncRcForceCfg *rc_force;
  MppEncRefFrmUsrCfg *frm_cfg;
  HalEncTask *task_local;
  void *ctx_local;
  
  frm_cfg = (MppEncRefFrmUsrCfg *)task;
  task_local = (HalEncTask *)ctx;
  if ((h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","enter\n","h264e_start");
  }
  RVar1 = mpp_frame_has_meta(*(MppFrame *)(frm_cfg + 3));
  if (RVar1 != 0) {
    rc_force = *(EncRcForceCfg **)&frm_cfg->force_lt_idx;
    meta = (MppMeta)(*(long *)&frm_cfg->force_pskip + 0x128);
    _force_use_lt_idx = mpp_frame_get_meta(*(MppFrame *)(frm_cfg + 3));
    force_frame_qp = -1;
    base_layer_pid = -1;
    force_tid = -1;
    local_40 = 0xffffffff;
    p._4_4_ = 0xffffffff;
    mpp_meta_get_s32(_force_use_lt_idx,KEY_ENC_MARK_LTR,&force_frame_qp);
    mpp_meta_get_s32(_force_use_lt_idx,KEY_ENC_USE_LTR,&base_layer_pid);
    mpp_meta_get_s32(_force_use_lt_idx,KEY_ENC_FRAME_QP,&force_tid);
    mpp_meta_get_s32(_force_use_lt_idx,KEY_ENC_BASE_LAYER_PID,(RK_S32 *)&local_40);
    mpp_meta_get_s32(_force_use_lt_idx,KEY_TEMPORAL_ID,(RK_S32 *)((long)&p + 4));
    if (-1 < force_frame_qp) {
      rc_force->force_flag = rc_force->force_flag | 4;
      rc_force->reserve[2] = force_frame_qp;
    }
    if (-1 < base_layer_pid) {
      rc_force->force_flag = rc_force->force_flag | 0x10;
      rc_force->reserve[4] = 5;
      rc_force->reserve[5] = base_layer_pid;
    }
    if (-1 < (int)p._4_4_) {
      rc_force->force_flag = rc_force->force_flag | 8;
      rc_force->reserve[3] = p._4_4_;
    }
    if (force_tid < 0) {
      *(uint *)meta = *meta & 0xfffffffe;
      *(undefined4 *)((long)meta + 4) = 0xffffffff;
    }
    else {
      *(undefined4 *)meta = 1;
      *(RK_S32 *)((long)meta + 4) = force_tid;
    }
    if (-1 < (int)local_40) {
      task_local->rc_task[2].force.reserve[0] = local_40;
    }
  }
  if ((h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","leave\n","h264e_start");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET h264e_start(void *ctx, HalEncTask *task)
{
    h264e_dbg_func("enter\n");

    if (mpp_frame_has_meta(task->frame)) {
        MppEncRefFrmUsrCfg *frm_cfg = task->frm_cfg;
        EncRcForceCfg *rc_force = &task->rc_task->force;
        MppMeta meta = mpp_frame_get_meta(task->frame);
        RK_S32 force_lt_idx = -1;
        RK_S32 force_use_lt_idx = -1;
        RK_S32 force_frame_qp = -1;
        RK_S32 base_layer_pid = -1;
        RK_S32 force_tid = -1;

        mpp_meta_get_s32(meta, KEY_ENC_MARK_LTR, &force_lt_idx);
        mpp_meta_get_s32(meta, KEY_ENC_USE_LTR, &force_use_lt_idx);
        mpp_meta_get_s32(meta, KEY_ENC_FRAME_QP, &force_frame_qp);
        mpp_meta_get_s32(meta, KEY_ENC_BASE_LAYER_PID, &base_layer_pid);
        mpp_meta_get_s32(meta, KEY_TEMPORAL_ID, &force_tid);

        if (force_lt_idx >= 0) {
            frm_cfg->force_flag |= ENC_FORCE_LT_REF_IDX;
            frm_cfg->force_lt_idx = force_lt_idx;
        }

        if (force_use_lt_idx >= 0) {
            frm_cfg->force_flag |= ENC_FORCE_REF_MODE;
            frm_cfg->force_ref_mode = REF_TO_LT_REF_IDX;
            frm_cfg->force_ref_arg = force_use_lt_idx;
        }

        if (force_tid >= 0) {
            frm_cfg->force_flag |= ENC_FORCE_TEMPORAL_ID;
            frm_cfg->force_temporal_id = force_tid;
        }

        if (force_frame_qp >= 0) {
            rc_force->force_flag = ENC_RC_FORCE_QP;
            rc_force->force_qp = force_frame_qp;
        } else {
            rc_force->force_flag &= (~ENC_RC_FORCE_QP);
            rc_force->force_qp = -1;
        }

        if (base_layer_pid >= 0) {
            H264eCtx *p = (H264eCtx *)ctx;
            MppEncH264Cfg *h264 = &p->cfg->codec.h264;

            h264->base_layer_pid = base_layer_pid;
        }
    }

    h264e_dbg_func("leave\n");

    return MPP_OK;
}